

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_valddi.cpp
# Opt level: O0

ze_result_t
validation_layer::zesDiagnosticsRunTests
          (zes_diag_handle_t hDiagnostics,uint32_t startIndex,uint32_t endIndex,
          zes_diag_result_t *pResult)

{
  code *pcVar1;
  ze_result_t zVar2;
  ze_result_t result_00;
  element_type *this;
  size_type sVar3;
  reference ppvVar4;
  pointer pHVar5;
  size_type sStack_90;
  ze_result_t result_2;
  size_t i_1;
  ze_result_t driver_result;
  ze_result_t result_1;
  ze_result_t result;
  size_t i;
  size_type numValHandlers;
  zes_pfnDiagnosticsRunTests_t pfnRunTests;
  allocator local_49;
  string local_48 [32];
  zes_diag_result_t *local_28;
  zes_diag_result_t *pResult_local;
  uint32_t endIndex_local;
  uint32_t startIndex_local;
  zes_diag_handle_t hDiagnostics_local;
  
  local_28 = pResult;
  pResult_local._0_4_ = endIndex;
  pResult_local._4_4_ = startIndex;
  _endIndex_local = hDiagnostics;
  this = std::__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                    )(context + 0xd50));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_48,"zesDiagnosticsRunTests(hDiagnostics, startIndex, endIndex, pResult)",
             &local_49);
  loader::Logger::log_trace(this,(string *)local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  pcVar1 = *(code **)(context + 0xce0);
  if (pcVar1 == (code *)0x0) {
    hDiagnostics_local._4_4_ =
         logAndPropagateResult("zesDiagnosticsRunTests",ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);
  }
  else {
    sVar3 = std::
            vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
            ::size((vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                    *)(context + 0xd30));
    for (_result_1 = 0; _result_1 < sVar3; _result_1 = _result_1 + 1) {
      ppvVar4 = std::
                vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                ::operator[]((vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                              *)(context + 0xd30),_result_1);
      zVar2 = (*(*ppvVar4)->zesValidation->_vptr_ZESValidationEntryPoints[0x40])
                        ((*ppvVar4)->zesValidation,_endIndex_local,(ulong)pResult_local._4_4_,
                         (ulong)(uint32_t)pResult_local,local_28);
      if (zVar2 != ZE_RESULT_SUCCESS) {
        zVar2 = logAndPropagateResult("zesDiagnosticsRunTests",zVar2);
        return zVar2;
      }
    }
    if ((*(byte *)(context + 4) & 1) != 0) {
      pHVar5 = std::
               unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
               ::operator->((unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                             *)(context + 0xd48));
      zVar2 = ZESHandleLifetimeValidation::zesDiagnosticsRunTestsPrologue
                        (&pHVar5->zesHandleLifetime,_endIndex_local,pResult_local._4_4_,
                         (uint32_t)pResult_local,local_28);
      if (zVar2 != ZE_RESULT_SUCCESS) {
        zVar2 = logAndPropagateResult("zesDiagnosticsRunTests",zVar2);
        return zVar2;
      }
    }
    zVar2 = (*pcVar1)(_endIndex_local,pResult_local._4_4_,(uint32_t)pResult_local,local_28);
    for (sStack_90 = 0; sStack_90 < sVar3; sStack_90 = sStack_90 + 1) {
      ppvVar4 = std::
                vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                ::operator[]((vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                              *)(context + 0xd30),sStack_90);
      result_00 = (*(*ppvVar4)->zesValidation->_vptr_ZESValidationEntryPoints[0x41])
                            ((*ppvVar4)->zesValidation,_endIndex_local,(ulong)pResult_local._4_4_,
                             (ulong)(uint32_t)pResult_local,local_28,(ulong)zVar2);
      if (result_00 != ZE_RESULT_SUCCESS) {
        zVar2 = logAndPropagateResult("zesDiagnosticsRunTests",result_00);
        return zVar2;
      }
    }
    hDiagnostics_local._4_4_ = logAndPropagateResult("zesDiagnosticsRunTests",zVar2);
  }
  return hDiagnostics_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesDiagnosticsRunTests(
        zes_diag_handle_t hDiagnostics,                 ///< [in] Handle for the component.
        uint32_t startIndex,                            ///< [in] The index of the first test to run. Set to
                                                        ///< ::ZES_DIAG_FIRST_TEST_INDEX to start from the beginning.
        uint32_t endIndex,                              ///< [in] The index of the last test to run. Set to
                                                        ///< ::ZES_DIAG_LAST_TEST_INDEX to complete all tests after the start test.
        zes_diag_result_t* pResult                      ///< [in,out] The result of the diagnostics
        )
    {
        context.logger->log_trace("zesDiagnosticsRunTests(hDiagnostics, startIndex, endIndex, pResult)");

        auto pfnRunTests = context.zesDdiTable.Diagnostics.pfnRunTests;

        if( nullptr == pfnRunTests )
            return logAndPropagateResult("zesDiagnosticsRunTests", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zesValidation->zesDiagnosticsRunTestsPrologue( hDiagnostics, startIndex, endIndex, pResult );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesDiagnosticsRunTests", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zesHandleLifetime.zesDiagnosticsRunTestsPrologue( hDiagnostics, startIndex, endIndex, pResult );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesDiagnosticsRunTests", result);
        }

        auto driver_result = pfnRunTests( hDiagnostics, startIndex, endIndex, pResult );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zesValidation->zesDiagnosticsRunTestsEpilogue( hDiagnostics, startIndex, endIndex, pResult ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesDiagnosticsRunTests", result);
        }

        return logAndPropagateResult("zesDiagnosticsRunTests", driver_result);
    }